

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

MessageLite * google::protobuf::internal::DuplicateIfNonNullInternal(MessageLite *message)

{
  long *in_RDI;
  MessageLite *ret;
  MessageLite *local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (MessageLite *)0x0;
  }
  else {
    local_8 = (MessageLite *)(**(code **)(*in_RDI + 0x18))();
    (*local_8->_vptr_MessageLite[8])(local_8,in_RDI);
  }
  return local_8;
}

Assistant:

MessageLite* DuplicateIfNonNullInternal(MessageLite* message) {
  if (message) {
    MessageLite* ret = message->New();
    ret->CheckTypeAndMergeFrom(*message);
    return ret;
  } else {
    return NULL;
  }
}